

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  ulong *puVar17;
  byte bVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2600;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined4 local_25c0;
  undefined4 uStack_25bc;
  undefined4 uStack_25b8;
  undefined4 uStack_25b4;
  undefined4 uStack_25b0;
  undefined4 uStack_25ac;
  undefined4 uStack_25a8;
  undefined4 uStack_25a4;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  puVar17 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar51._4_4_ = fVar3;
  auVar51._0_4_ = fVar3;
  auVar51._8_4_ = fVar3;
  auVar51._12_4_ = fVar3;
  auVar51._16_4_ = fVar3;
  auVar51._20_4_ = fVar3;
  auVar51._24_4_ = fVar3;
  auVar51._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar52._4_4_ = fVar4;
  auVar52._0_4_ = fVar4;
  auVar52._8_4_ = fVar4;
  auVar52._12_4_ = fVar4;
  auVar52._16_4_ = fVar4;
  auVar52._20_4_ = fVar4;
  auVar52._24_4_ = fVar4;
  auVar52._28_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar53._4_4_ = fVar5;
  auVar53._0_4_ = fVar5;
  auVar53._8_4_ = fVar5;
  auVar53._12_4_ = fVar5;
  auVar53._16_4_ = fVar5;
  auVar53._20_4_ = fVar5;
  auVar53._24_4_ = fVar5;
  auVar53._28_4_ = fVar5;
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar5 = fVar5 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar59 = ZEXT3264(auVar30);
  auVar54._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar54._8_4_ = -fVar3;
  auVar54._12_4_ = -fVar3;
  auVar54._16_4_ = -fVar3;
  auVar54._20_4_ = -fVar3;
  auVar54._24_4_ = -fVar3;
  auVar54._28_4_ = -fVar3;
  auVar55._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar55._8_4_ = -fVar4;
  auVar55._12_4_ = -fVar4;
  auVar55._16_4_ = -fVar4;
  auVar55._20_4_ = -fVar4;
  auVar55._24_4_ = -fVar4;
  auVar55._28_4_ = -fVar4;
  auVar56._0_8_ = CONCAT44(fVar5,fVar5) ^ 0x8000000080000000;
  auVar56._8_4_ = -fVar5;
  auVar56._12_4_ = -fVar5;
  auVar56._16_4_ = -fVar5;
  auVar56._20_4_ = -fVar5;
  auVar56._24_4_ = -fVar5;
  auVar56._28_4_ = -fVar5;
  iVar6 = (tray->tnear).field_0.i[k];
  auVar57._4_4_ = iVar6;
  auVar57._0_4_ = iVar6;
  auVar57._8_4_ = iVar6;
  auVar57._12_4_ = iVar6;
  auVar57._16_4_ = iVar6;
  auVar57._20_4_ = iVar6;
  auVar57._24_4_ = iVar6;
  auVar57._28_4_ = iVar6;
  auVar30 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar58._8_4_ = 0xfffffff8;
  auVar58._0_8_ = 0xfffffff8fffffff8;
  auVar58._12_4_ = 0xfffffff8;
  auVar58._16_4_ = 0xfffffff8;
  auVar58._20_4_ = 0xfffffff8;
  auVar58._24_4_ = 0xfffffff8;
  auVar58._28_4_ = 0xfffffff8;
  do {
    pfVar1 = (float *)(puVar17 + -1);
    puVar17 = puVar17 + -2;
    if (*pfVar1 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar23 = *puVar17;
      while ((uVar23 & 8) == 0) {
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar20),auVar54,auVar51);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar21),auVar55,auVar52);
        auVar33 = vpmaxsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar16));
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + uVar22),auVar56,auVar53);
        auVar31 = vpmaxsd_avx2(ZEXT1632(auVar29),auVar57);
        auVar31 = vpmaxsd_avx512vl(auVar33,auVar31);
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + (uVar20 ^ 0x20)),auVar54,
                                  auVar51);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + (uVar21 ^ 0x20)),auVar55,
                                  auVar52);
        auVar33 = vpminsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar16));
        auVar29 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar23 + 0x40 + (uVar22 ^ 0x20)),auVar56,
                                  auVar53);
        auVar32 = vpminsd_avx512vl(ZEXT1632(auVar29),auVar59._0_32_);
        auVar33 = vpminsd_avx2(auVar33,auVar32);
        uVar24 = vpcmpd_avx512vl(auVar31,auVar33,2);
        bVar18 = (byte)uVar24;
        if (bVar18 == 0) goto LAB_00798a6a;
        auVar33 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar23 & 0xfffffffffffffff0));
        auVar32 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar23 & 0xfffffffffffffff0))[1]);
        auVar34 = vmovdqa64_avx512vl(auVar30);
        auVar34 = vpternlogd_avx512vl(auVar34,auVar31,auVar58,0xf8);
        auVar35 = vpcompressd_avx512vl(auVar34);
        auVar40._0_4_ =
             (uint)(bVar18 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar34._0_4_;
        bVar9 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar9 * auVar35._4_4_ | (uint)!bVar9 * auVar34._4_4_;
        bVar9 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar9 * auVar35._8_4_ | (uint)!bVar9 * auVar34._8_4_;
        bVar9 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar9 * auVar35._12_4_ | (uint)!bVar9 * auVar34._12_4_;
        bVar9 = (bool)((byte)(uVar24 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar9 * auVar35._16_4_ | (uint)!bVar9 * auVar34._16_4_;
        bVar9 = (bool)((byte)(uVar24 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar9 * auVar35._20_4_ | (uint)!bVar9 * auVar34._20_4_;
        bVar9 = (bool)((byte)(uVar24 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar9 * auVar35._24_4_ | (uint)!bVar9 * auVar34._24_4_;
        bVar9 = SUB81(uVar24 >> 7,0);
        auVar40._28_4_ = (uint)bVar9 * auVar35._28_4_ | (uint)!bVar9 * auVar34._28_4_;
        auVar34 = vmovdqa64_avx512vl(auVar33);
        auVar34 = vpermt2q_avx512vl(auVar34,auVar40,auVar32);
        uVar23 = auVar34._0_8_;
        bVar18 = bVar18 - 1 & bVar18;
        if (bVar18 != 0) {
          auVar34 = vpshufd_avx512vl(auVar40,0x55);
          auVar35 = vmovdqa64_avx512vl(auVar33);
          vpermt2q_avx512vl(auVar35,auVar34,auVar32);
          auVar35 = vpminsd_avx512vl(auVar40,auVar34);
          auVar34 = vpmaxsd_avx512vl(auVar40,auVar34);
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 == 0) {
            auVar35 = vpermi2q_avx512vl(auVar35,auVar33,auVar32);
            uVar23 = auVar35._0_8_;
            auVar33 = vpermt2q_avx512vl(auVar33,auVar34,auVar32);
            *puVar17 = auVar33._0_8_;
            auVar33 = vpermd_avx512vl(auVar34,auVar31);
            *(int *)(puVar17 + 1) = auVar33._0_4_;
            puVar17 = puVar17 + 2;
          }
          else {
            auVar36 = vpshufd_avx512vl(auVar40,0xaa);
            auVar37 = vmovdqa64_avx512vl(auVar33);
            vpermt2q_avx512vl(auVar37,auVar36,auVar32);
            auVar37 = vpminsd_avx512vl(auVar35,auVar36);
            auVar35 = vpmaxsd_avx2(auVar35,auVar36);
            auVar36 = vpminsd_avx2(auVar34,auVar35);
            auVar34 = vpmaxsd_avx2(auVar34,auVar35);
            bVar18 = bVar18 - 1 & bVar18;
            if (bVar18 == 0) {
              auVar35 = vpermi2q_avx512vl(auVar37,auVar33,auVar32);
              uVar23 = auVar35._0_8_;
              auVar35 = vmovdqa64_avx512vl(auVar33);
              auVar35 = vpermt2q_avx512vl(auVar35,auVar34,auVar32);
              *puVar17 = auVar35._0_8_;
              auVar34 = vpermd_avx512vl(auVar34,auVar31);
              *(int *)(puVar17 + 1) = auVar34._0_4_;
              auVar33 = vpermt2q_avx512vl(auVar33,auVar36,auVar32);
              puVar17[2] = auVar33._0_8_;
              auVar33 = vpermd_avx512vl(auVar36,auVar31);
              *(int *)(puVar17 + 3) = auVar33._0_4_;
              puVar17 = puVar17 + 4;
            }
            else {
              auVar35 = vpshufd_avx512vl(auVar40,0xff);
              auVar38 = vmovdqa64_avx512vl(auVar33);
              vpermt2q_avx512vl(auVar38,auVar35,auVar32);
              auVar38 = vpminsd_avx512vl(auVar37,auVar35);
              auVar35 = vpmaxsd_avx512vl(auVar37,auVar35);
              auVar37 = vpminsd_avx512vl(auVar36,auVar35);
              auVar35 = vpmaxsd_avx512vl(auVar36,auVar35);
              auVar36 = vpminsd_avx512vl(auVar34,auVar35);
              auVar34 = vpmaxsd_avx512vl(auVar34,auVar35);
              bVar18 = bVar18 - 1 & bVar18;
              if (bVar18 == 0) {
                auVar35 = vpermi2q_avx512vl(auVar38,auVar33,auVar32);
                uVar23 = auVar35._0_8_;
                auVar35 = vmovdqa64_avx512vl(auVar33);
                auVar35 = vpermt2q_avx512vl(auVar35,auVar34,auVar32);
                *puVar17 = auVar35._0_8_;
                auVar34 = vpermd_avx512vl(auVar34,auVar31);
                *(int *)(puVar17 + 1) = auVar34._0_4_;
                auVar34 = vmovdqa64_avx512vl(auVar33);
                auVar34 = vpermt2q_avx512vl(auVar34,auVar36,auVar32);
                puVar17[2] = auVar34._0_8_;
                auVar34 = vpermd_avx512vl(auVar36,auVar31);
                *(int *)(puVar17 + 3) = auVar34._0_4_;
                auVar33 = vpermt2q_avx512vl(auVar33,auVar37,auVar32);
                puVar17[4] = auVar33._0_8_;
                auVar33 = vpermd_avx512vl(auVar37,auVar31);
                *(int *)(puVar17 + 5) = auVar33._0_4_;
                puVar17 = puVar17 + 6;
              }
              else {
                auVar39 = valignd_avx512vl(auVar40,auVar40,3);
                auVar29 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                auVar35 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                auVar40 = vpermt2d_avx512vl(ZEXT1632(auVar29),auVar35,auVar38);
                auVar35 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar40 = vpermt2d_avx512vl(auVar40,auVar35,auVar37);
                auVar40 = vpermt2d_avx512vl(auVar40,auVar35,auVar36);
                auVar35 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar34 = vpermt2d_avx512vl(auVar40,auVar35,auVar34);
                auVar60 = ZEXT3264(auVar34);
                bVar26 = bVar18;
                do {
                  auVar36 = auVar60._0_32_;
                  auVar35 = vmovdqa64_avx512vl(auVar36);
                  auVar34._8_4_ = 1;
                  auVar34._0_8_ = 0x100000001;
                  auVar34._12_4_ = 1;
                  auVar34._16_4_ = 1;
                  auVar34._20_4_ = 1;
                  auVar34._24_4_ = 1;
                  auVar34._28_4_ = 1;
                  auVar34 = vpermd_avx2(auVar34,auVar39);
                  auVar39 = valignd_avx512vl(auVar39,auVar39,1);
                  auVar40 = vmovdqa64_avx512vl(auVar33);
                  vpermt2q_avx512vl(auVar40,auVar39,auVar32);
                  bVar26 = bVar26 - 1 & bVar26;
                  uVar13 = vpcmpd_avx512vl(auVar34,auVar36,5);
                  auVar34 = vpmaxsd_avx512vl(auVar34,auVar36);
                  bVar14 = (byte)uVar13 << 1;
                  auVar35 = valignd_avx512vl(auVar35,auVar35,7);
                  bVar9 = (bool)((byte)uVar13 & 1);
                  auVar36._4_4_ = (uint)bVar9 * auVar35._4_4_ | (uint)!bVar9 * auVar34._4_4_;
                  auVar36._0_4_ = auVar34._0_4_;
                  bVar9 = (bool)(bVar14 >> 2 & 1);
                  auVar36._8_4_ = (uint)bVar9 * auVar35._8_4_ | (uint)!bVar9 * auVar34._8_4_;
                  bVar9 = (bool)(bVar14 >> 3 & 1);
                  auVar36._12_4_ = (uint)bVar9 * auVar35._12_4_ | (uint)!bVar9 * auVar34._12_4_;
                  bVar9 = (bool)(bVar14 >> 4 & 1);
                  auVar36._16_4_ = (uint)bVar9 * auVar35._16_4_ | (uint)!bVar9 * auVar34._16_4_;
                  bVar9 = (bool)(bVar14 >> 5 & 1);
                  auVar36._20_4_ = (uint)bVar9 * auVar35._20_4_ | (uint)!bVar9 * auVar34._20_4_;
                  bVar9 = (bool)(bVar14 >> 6 & 1);
                  auVar36._24_4_ = (uint)bVar9 * auVar35._24_4_ | (uint)!bVar9 * auVar34._24_4_;
                  auVar36._28_4_ =
                       (uint)(bVar14 >> 7) * auVar35._28_4_ |
                       (uint)!(bool)(bVar14 >> 7) * auVar34._28_4_;
                  auVar60 = ZEXT3264(auVar36);
                } while (bVar26 != 0);
                lVar19 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
                auVar34 = vmovdqa64_avx512vl(auVar36);
                do {
                  auVar34 = vpermi2q_avx512vl(auVar34,auVar33,auVar32);
                  *puVar17 = auVar34._0_8_;
                  auVar35 = auVar60._0_32_;
                  auVar34 = vpermd_avx512vl(auVar35,auVar31);
                  *(int *)(puVar17 + 1) = auVar34._0_4_;
                  auVar34 = valignd_avx512vl(auVar35,auVar35,1);
                  puVar17 = puVar17 + 2;
                  auVar35 = vmovdqa64_avx512vl(auVar34);
                  auVar60 = ZEXT3264(auVar35);
                  lVar19 = lVar19 + -1;
                } while (lVar19 != 0);
                auVar33 = vpermt2q_avx512vl(auVar33,auVar34,auVar32);
                uVar23 = auVar33._0_8_;
              }
            }
          }
        }
      }
      uVar24 = (ulong)((uint)uVar23 & 0xf);
      if (uVar24 != 8) {
        local_25c0 = *(undefined4 *)(ray + k * 4);
        uStack_25bc = local_25c0;
        uStack_25b8 = local_25c0;
        uStack_25b4 = local_25c0;
        uStack_25b0 = local_25c0;
        uStack_25ac = local_25c0;
        uStack_25a8 = local_25c0;
        uStack_25a4 = local_25c0;
        auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
        uVar23 = uVar23 & 0xfffffffffffffff0;
        auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        lVar19 = 0;
        do {
          lVar28 = lVar19 * 0xe0;
          lVar2 = uVar23 + 0xd0 + lVar28;
          local_25a0 = *(undefined8 *)(lVar2 + 0x10);
          uStack_2598 = *(undefined8 *)(lVar2 + 0x18);
          lVar2 = uVar23 + 0xc0 + lVar28;
          local_25e0 = *(undefined8 *)(lVar2 + 0x10);
          uStack_25d8 = *(undefined8 *)(lVar2 + 0x18);
          uStack_25d0 = local_25e0;
          uStack_25c8 = uStack_25d8;
          uStack_2590 = local_25a0;
          uStack_2588 = uStack_2598;
          auVar46._16_16_ = *(undefined1 (*) [16])(uVar23 + 0x60 + lVar28);
          auVar46._0_16_ = *(undefined1 (*) [16])(uVar23 + lVar28);
          auVar47._16_16_ = *(undefined1 (*) [16])(uVar23 + 0x70 + lVar28);
          auVar47._0_16_ = *(undefined1 (*) [16])(uVar23 + 0x10 + lVar28);
          auVar48._16_16_ = *(undefined1 (*) [16])(uVar23 + 0x80 + lVar28);
          auVar48._0_16_ = *(undefined1 (*) [16])(uVar23 + 0x20 + lVar28);
          auVar29 = *(undefined1 (*) [16])(uVar23 + 0x30 + lVar28);
          auVar42._16_16_ = auVar29;
          auVar42._0_16_ = auVar29;
          auVar36 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x10 + lVar28));
          auVar37 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x14 + lVar28));
          auVar38 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x24 + lVar28));
          auVar39 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x28 + lVar28));
          auVar41 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x2c + lVar28));
          auVar40 = vsubps_avx(auVar46,auVar42);
          auVar42 = vsubps_avx512vl(auVar47,auVar36);
          auVar43 = vsubps_avx512vl(auVar48,auVar37);
          auVar44 = vsubps_avx512vl(auVar38,auVar46);
          auVar45 = vsubps_avx512vl(auVar39,auVar47);
          auVar41 = vsubps_avx512vl(auVar41,auVar48);
          auVar36 = vmulps_avx512vl(auVar42,auVar41);
          local_2500 = vfmsub231ps_avx512vl(auVar36,auVar45,auVar43);
          auVar36 = vmulps_avx512vl(auVar43,auVar44);
          local_24e0 = vfmsub231ps_avx512vl(auVar36,auVar41,auVar40);
          auVar36 = vmulps_avx512vl(auVar40,auVar45);
          local_24c0 = vfmsub231ps_avx512vl(auVar36,auVar44,auVar42);
          auVar39._4_4_ = local_25c0;
          auVar39._0_4_ = local_25c0;
          auVar39._8_4_ = local_25c0;
          auVar39._12_4_ = local_25c0;
          auVar39._16_4_ = local_25c0;
          auVar39._20_4_ = local_25c0;
          auVar39._24_4_ = local_25c0;
          auVar39._28_4_ = local_25c0;
          auVar36 = vsubps_avx(auVar46,auVar39);
          auVar39 = vsubps_avx512vl(auVar47,auVar33);
          auVar46 = vsubps_avx512vl(auVar48,auVar31);
          auVar37 = vmulps_avx512vl(auVar34,auVar46);
          auVar47 = vfmsub231ps_avx512vl(auVar37,auVar39,auVar35);
          auVar37 = vmulps_avx512vl(auVar35,auVar36);
          auVar48 = vfmsub231ps_avx512vl(auVar37,auVar46,auVar32);
          auVar37 = vmulps_avx512vl(auVar32,auVar39);
          auVar49 = vfmsub231ps_avx512vl(auVar37,auVar36,auVar34);
          auVar37 = vmulps_avx512vl(local_24c0,auVar35);
          auVar37 = vfmadd231ps_avx512vl(auVar37,local_24e0,auVar34);
          local_2520 = vfmadd231ps_avx512vl(auVar37,local_2500,auVar32);
          auVar37._8_4_ = 0x7fffffff;
          auVar37._0_8_ = 0x7fffffff7fffffff;
          auVar37._12_4_ = 0x7fffffff;
          auVar37._16_4_ = 0x7fffffff;
          auVar37._20_4_ = 0x7fffffff;
          auVar37._24_4_ = 0x7fffffff;
          auVar37._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_2520,auVar37);
          auVar38._8_4_ = 0x80000000;
          auVar38._0_8_ = 0x8000000080000000;
          auVar38._12_4_ = 0x80000000;
          auVar38._16_4_ = 0x80000000;
          auVar38._20_4_ = 0x80000000;
          auVar38._24_4_ = 0x80000000;
          auVar38._28_4_ = 0x80000000;
          vandps_avx512vl(local_2520,auVar38);
          auVar37 = vmulps_avx512vl(auVar41,auVar49);
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar45);
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar47,auVar44);
          local_2580 = vxorps_avx512vl(local_2520,auVar37);
          auVar37 = vmulps_avx512vl(auVar43,auVar49);
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar48);
          auVar40 = vfmadd231ps_avx512vl(auVar37,auVar40,auVar47);
          local_2560 = vxorps_avx512vl(local_2520,auVar40);
          uVar13 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
          uVar10 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
          uVar11 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
          auVar40 = vaddps_avx512vl(local_2580,local_2560);
          uVar12 = vcmpps_avx512vl(auVar40,local_2520,2);
          local_24a0 = (byte)uVar13 & (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
          if (local_24a0 != 0) {
            auVar40 = vmulps_avx512vl(local_24c0,auVar46);
            auVar40 = vfmadd213ps_avx512vl(auVar39,local_24e0,auVar40);
            auVar40 = vfmadd213ps_avx512vl(auVar36,local_2500,auVar40);
            local_2540._0_4_ = local_2520._0_4_ ^ auVar40._0_4_;
            local_2540._4_4_ = local_2520._4_4_ ^ auVar40._4_4_;
            local_2540._8_4_ = local_2520._8_4_ ^ auVar40._8_4_;
            local_2540._12_4_ = local_2520._12_4_ ^ auVar40._12_4_;
            local_2540._16_4_ = local_2520._16_4_ ^ auVar40._16_4_;
            local_2540._20_4_ = local_2520._20_4_ ^ auVar40._20_4_;
            local_2540._24_4_ = local_2520._24_4_ ^ auVar40._24_4_;
            local_2540._28_4_ = local_2520._28_4_ ^ auVar40._28_4_;
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar41._4_4_ = uVar7;
            auVar41._0_4_ = uVar7;
            auVar41._8_4_ = uVar7;
            auVar41._12_4_ = uVar7;
            auVar41._16_4_ = uVar7;
            auVar41._20_4_ = uVar7;
            auVar41._24_4_ = uVar7;
            auVar41._28_4_ = uVar7;
            auVar40 = vmulps_avx512vl(local_2520,auVar41);
            uVar13 = vcmpps_avx512vl(auVar40,local_2540,1);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar43._4_4_ = uVar7;
            auVar43._0_4_ = uVar7;
            auVar43._8_4_ = uVar7;
            auVar43._12_4_ = uVar7;
            auVar43._16_4_ = uVar7;
            auVar43._20_4_ = uVar7;
            auVar43._24_4_ = uVar7;
            auVar43._28_4_ = uVar7;
            auVar40 = vmulps_avx512vl(local_2520,auVar43);
            uVar10 = vcmpps_avx512vl(local_2540,auVar40,2);
            local_24a0 = (byte)uVar13 & (byte)uVar10 & local_24a0;
            if (local_24a0 != 0) {
              local_23c0 = 0xf0;
              auVar40 = vrcp14ps_avx512vl(local_2520);
              auVar45._8_4_ = 0x3f800000;
              auVar45._0_8_ = 0x3f8000003f800000;
              auVar45._12_4_ = 0x3f800000;
              auVar45._16_4_ = 0x3f800000;
              auVar45._20_4_ = 0x3f800000;
              auVar45._24_4_ = 0x3f800000;
              auVar45._28_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_avx512vl(local_2520,auVar40,auVar45);
              auVar36 = vfmadd132ps_avx512vl(auVar36,auVar40,auVar40);
              local_2440 = vmulps_avx512vl(auVar36,local_2540);
              auVar40 = vmulps_avx512vl(auVar36,local_2580);
              auVar40 = vminps_avx(auVar40,auVar45);
              auVar36 = vmulps_avx512vl(auVar36,local_2560);
              auVar36 = vminps_avx(auVar36,auVar45);
              auVar37 = vsubps_avx(auVar45,auVar40);
              auVar38 = vsubps_avx(auVar45,auVar36);
              local_2460 = vblendps_avx(auVar36,auVar37,0xf0);
              local_2480 = vblendps_avx(auVar40,auVar38,0xf0);
              local_2420 = vmulps_avx512vl(local_2500,_DAT_01fef940);
              local_2400 = vmulps_avx512vl(local_24e0,_DAT_01fef940);
              local_23e0 = vmulps_avx512vl(local_24c0,_DAT_01fef940);
              auVar49._8_4_ = 0x7f800000;
              auVar49._0_8_ = 0x7f8000007f800000;
              auVar49._12_4_ = 0x7f800000;
              auVar49._16_4_ = 0x7f800000;
              auVar49._20_4_ = 0x7f800000;
              auVar49._24_4_ = 0x7f800000;
              auVar49._28_4_ = 0x7f800000;
              auVar40 = vblendmps_avx512vl(auVar49,local_2440);
              auVar44._0_4_ =
                   (uint)(local_24a0 & 1) * auVar40._0_4_ |
                   (uint)!(bool)(local_24a0 & 1) * local_23e0._0_4_;
              bVar9 = (bool)(local_24a0 >> 1 & 1);
              auVar44._4_4_ = (uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * local_23e0._4_4_;
              bVar9 = (bool)(local_24a0 >> 2 & 1);
              auVar44._8_4_ = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * local_23e0._8_4_;
              bVar9 = (bool)(local_24a0 >> 3 & 1);
              auVar44._12_4_ = (uint)bVar9 * auVar40._12_4_ | (uint)!bVar9 * local_23e0._12_4_;
              bVar9 = (bool)(local_24a0 >> 4 & 1);
              auVar44._16_4_ = (uint)bVar9 * auVar40._16_4_ | (uint)!bVar9 * local_23e0._16_4_;
              bVar9 = (bool)(local_24a0 >> 5 & 1);
              auVar44._20_4_ = (uint)bVar9 * auVar40._20_4_ | (uint)!bVar9 * local_23e0._20_4_;
              bVar9 = (bool)(local_24a0 >> 6 & 1);
              auVar44._24_4_ = (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * local_23e0._24_4_;
              auVar44._28_4_ =
                   (uint)(local_24a0 >> 7) * auVar40._28_4_ |
                   (uint)!(bool)(local_24a0 >> 7) * local_23e0._28_4_;
              auVar40 = vshufps_avx(auVar44,auVar44,0xb1);
              auVar40 = vminps_avx(auVar44,auVar40);
              auVar36 = vshufpd_avx(auVar40,auVar40,5);
              auVar40 = vminps_avx(auVar40,auVar36);
              auVar36 = vpermpd_avx2(auVar40,0x4e);
              auVar40 = vminps_avx(auVar40,auVar36);
              uVar13 = vcmpps_avx512vl(auVar44,auVar40,0);
              bVar18 = local_24a0;
              if (((byte)uVar13 & local_24a0) != 0) {
                bVar18 = (byte)uVar13 & local_24a0;
              }
              uVar15 = 0;
              for (uVar27 = (uint)bVar18; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                uVar15 = uVar15 + 1;
              }
              local_2600 = (ulong)uVar15;
              uVar15 = *(uint *)((long)&local_25e0 + local_2600 * 4);
              while ((((context->scene->geometries).items[uVar15].ptr)->mask &
                     *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar18 = (byte)(1 << ((uint)local_2600 & 0x1f));
                if ((~bVar18 & local_24a0) == 0) goto LAB_00798716;
                local_24a0 = ~bVar18 & local_24a0;
                auVar40 = vblendmps_avx512vl(auVar49,local_2440);
                auVar50._0_4_ =
                     (uint)(local_24a0 & 1) * auVar40._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * auVar44._0_4_;
                bVar9 = (bool)(local_24a0 >> 1 & 1);
                auVar50._4_4_ = (uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar44._4_4_;
                bVar9 = (bool)(local_24a0 >> 2 & 1);
                auVar50._8_4_ = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar44._8_4_;
                bVar9 = (bool)(local_24a0 >> 3 & 1);
                auVar50._12_4_ = (uint)bVar9 * auVar40._12_4_ | (uint)!bVar9 * auVar44._12_4_;
                bVar9 = (bool)(local_24a0 >> 4 & 1);
                auVar50._16_4_ = (uint)bVar9 * auVar40._16_4_ | (uint)!bVar9 * auVar44._16_4_;
                bVar9 = (bool)(local_24a0 >> 5 & 1);
                auVar50._20_4_ = (uint)bVar9 * auVar40._20_4_ | (uint)!bVar9 * auVar44._20_4_;
                bVar9 = (bool)(local_24a0 >> 6 & 1);
                auVar50._24_4_ = (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * auVar44._24_4_;
                auVar50._28_4_ =
                     (uint)(local_24a0 >> 7) * auVar40._28_4_ |
                     (uint)!(bool)(local_24a0 >> 7) * auVar44._28_4_;
                auVar40 = vshufps_avx(auVar50,auVar50,0xb1);
                auVar40 = vminps_avx(auVar50,auVar40);
                auVar36 = vshufpd_avx(auVar40,auVar40,5);
                auVar40 = vminps_avx(auVar40,auVar36);
                auVar36 = vpermpd_avx2(auVar40,0x4e);
                auVar40 = vminps_avx(auVar40,auVar36);
                uVar13 = vcmpps_avx512vl(auVar50,auVar40,0);
                bVar26 = (byte)uVar13 & local_24a0;
                bVar18 = local_24a0;
                if (bVar26 != 0) {
                  bVar18 = bVar26;
                }
                uVar15 = 0;
                for (uVar27 = (uint)bVar18; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                  uVar15 = uVar15 + 1;
                }
                local_2600 = (ulong)uVar15;
                uVar15 = *(uint *)((long)&local_25e0 + local_2600 * 4);
                auVar44 = auVar50;
              }
              uVar25 = (ulong)((uint)local_2600 << 2);
              uVar7 = *(undefined4 *)(local_2480 + uVar25);
              uVar8 = *(undefined4 *)(local_2460 + uVar25);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar25);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar25);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar25);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar25);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar7;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_25a0 + uVar25);
              *(uint *)(ray + k * 4 + 0x120) = uVar15;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
LAB_00798716:
          lVar19 = lVar19 + 1;
        } while (lVar19 != uVar24 - 8);
      }
      auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
      auVar59 = ZEXT3264(auVar33);
    }
LAB_00798a6a:
    if (puVar17 == &local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }